

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqllogic_test_logger.cpp
# Opt level: O0

void __thiscall
duckdb::SQLLogicTestLogger::PrintExpectedResult
          (SQLLogicTestLogger *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          *values,idx_t columns,bool row_wise)

{
  size_type sVar1;
  undefined8 uVar2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  *pvVar3;
  byte in_CL;
  ulong in_RDX;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RSI;
  idx_t r_1;
  idx_t c;
  idx_t r;
  size_type in_stack_ffffffffffffffa8;
  FILE *pFVar4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  *in_stack_ffffffffffffffb0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  *this_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  *local_38;
  ulong local_30;
  ulong local_28;
  
  if ((in_CL & 1) == 0) {
    local_30 = 0;
    local_38 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                *)0x0;
    while (this_00 = local_38,
          pvVar3 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                    *)Catch::clara::std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::size(in_RSI), this_00 < pvVar3) {
      if (local_30 != 0) {
        fprintf(_stderr,anon_var_dwarf_6604c5 + 7);
      }
      pFVar4 = _stderr;
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
      ::operator[](this_00,(size_type)_stderr);
      uVar2 = std::__cxx11::string::c_str();
      fprintf(pFVar4,"%s",uVar2);
      local_30 = local_30 + 1;
      if (in_RDX <= local_30) {
        fprintf(_stderr,anon_var_dwarf_6600e4 + 8);
        local_30 = 0;
      }
      local_38 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  *)((long)&(local_38->
                            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + 1);
    }
  }
  else {
    for (local_28 = 0;
        sVar1 = Catch::clara::std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size(in_RSI), pFVar4 = _stderr, local_28 < sVar1; local_28 = local_28 + 1) {
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
      ::operator[](in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
      uVar2 = std::__cxx11::string::c_str();
      fprintf(pFVar4,"%s\n",uVar2);
    }
  }
  return;
}

Assistant:

void SQLLogicTestLogger::PrintExpectedResult(const vector<string> &values, idx_t columns, bool row_wise) {
	if (row_wise) {
		for (idx_t r = 0; r < values.size(); r++) {
			fprintf(stderr, "%s\n", values[r].c_str());
		}
	} else {
		idx_t c = 0;
		for (idx_t r = 0; r < values.size(); r++) {
			if (c != 0) {
				fprintf(stderr, "\t");
			}
			fprintf(stderr, "%s", values[r].c_str());
			c++;
			if (c >= columns) {
				fprintf(stderr, "\n");
				c = 0;
			}
		}
	}
}